

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBucket.cpp
# Opt level: O1

void __thiscall
Memory::
SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
::FinishPartialCollect
          (SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
           *this,RecyclerSweep *recyclerSweep)

{
  HeapBlockList *this_00;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *list;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *this_01;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  HeapInfo *in_RAX;
  Recycler *pRVar4;
  undefined4 *puVar5;
  SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *pSVar6;
  SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *pSVar7;
  SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> **in_R8;
  SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *tail_1;
  SmallHeapBlockT<SmallAllocationBlockAttributes> **ppSVar8;
  anon_class_16_2_3fe61e0b fn;
  undefined1 local_38 [8];
  SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *tail;
  
  local_38 = (undefined1  [8])in_RAX;
  if (recyclerSweep == (RecyclerSweep *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = RecyclerSweep::IsBackground(recyclerSweep);
  }
  HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
  VerifyHeapBlockCount
            (&this->
              super_HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
             ,bVar2);
  pRVar4 = HeapBucket::GetRecycler((HeapBucket *)this);
  if (pRVar4->inPartialCollectMode == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,0x253,"(this->GetRecycler()->inPartialCollectMode)",
                       "this->GetRecycler()->inPartialCollectMode");
    if (!bVar2) goto LAB_00755fc8;
    *puVar5 = 0;
  }
  if (recyclerSweep != (RecyclerSweep *)0x0) {
    bVar2 = HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
            ::IsAllocationStopped
                      (&this->
                        super_HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                      );
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,600,"(recyclerSweep == nullptr || this->IsAllocationStopped())",
                         "recyclerSweep == nullptr || this->IsAllocationStopped()");
      if (!bVar2) goto LAB_00755fc8;
      *puVar5 = 0;
    }
  }
  this_00 = (HeapBlockList *)this->partialSweptHeapBlockList;
  if (this_00 != (HeapBlockList *)0x0) {
    this->partialSweptHeapBlockList =
         (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
    local_38 = (undefined1  [8])0x0;
    fn.tail = in_R8;
    fn.this = (SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
               *)local_38;
    HeapBlockList::
    ForEach<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>,Memory::SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>::FinishPartialCollect(Memory::RecyclerSweep*)::_lambda(Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
              (this_00,(SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0,
               (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)this,fn);
    if (local_38 == (undefined1  [8])0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,0x268,"(tail != nullptr)","tail != nullptr");
      if (!bVar2) {
LAB_00755fc8:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    *(SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> **)
     ((long)local_38 + 0x20) = this->partialHeapBlockList;
    this->partialHeapBlockList =
         (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)this_00;
  }
  list = (SmallHeapBlockT<SmallAllocationBlockAttributes> *)this->partialHeapBlockList;
  if (recyclerSweep == (RecyclerSweep *)0x0) {
    if (list != (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      this->partialHeapBlockList =
           (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
      AppendAllocableHeapBlockList
                (&this->
                  super_HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                 ,(SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)list);
    }
  }
  else {
    if (list != (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      this->partialHeapBlockList =
           (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      pSVar7 = (this->
               super_HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
               ).heapBlockList;
      if (pSVar7 == (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
        ppSVar8 = (SmallHeapBlockT<SmallAllocationBlockAttributes> **)
                  &(this->
                   super_HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                   ).heapBlockList;
      }
      else {
        do {
          pSVar6 = pSVar7;
          this_01 = (pSVar6->super_SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>).
                    super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>.
                    super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next;
          if (this_01 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
            pSVar7 = (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
          }
          else {
            pSVar7 = HeapBlock::AsFinalizableWriteBarrierBlock<SmallAllocationBlockAttributes>
                               (&this_01->super_HeapBlock);
          }
        } while (pSVar7 != (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)
                           0x0);
        ppSVar8 = &(pSVar6->super_SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>).
                   super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>.
                   super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next;
      }
      *ppSVar8 = list;
    }
    uVar3 = HeapBucket::GetBucketIndex((HeapBucket *)this);
    if ((recyclerSweep->finalizableWithBarrierData).bucketData[uVar3].pendingSweepList ==
        (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
      StartAllocationAfterSweep
                (&this->
                  super_HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                );
    }
  }
  if (recyclerSweep == (RecyclerSweep *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = RecyclerSweep::IsBackground(recyclerSweep);
  }
  HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
  VerifyHeapBlockCount
            (&this->
              super_HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
             ,bVar2);
  return;
}

Assistant:

void
SmallNormalHeapBucketBase<TBlockType>::FinishPartialCollect(RecyclerSweep * recyclerSweep)
{
    RECYCLER_SLOW_CHECK(this->VerifyHeapBlockCount(recyclerSweep != nullptr && recyclerSweep->IsBackground()));

    Assert(this->GetRecycler()->inPartialCollectMode);

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    Assert(recyclerSweep == nullptr || this->IsAllocationStopped() || this->AllocationsStartedDuringConcurrentSweep());
#else
    Assert(recyclerSweep == nullptr || this->IsAllocationStopped());
#endif

#if ENABLE_CONCURRENT_GC
    // Process the partial Swept block and move it to the partial heap block list
    TBlockType * partialSweptList = this->partialSweptHeapBlockList;
    if (partialSweptList)
    {
        this->partialSweptHeapBlockList = nullptr;
        TBlockType *  tail = nullptr;
        HeapBlockList::ForEach(partialSweptList, [this, &tail](TBlockType * heapBlock)
        {
            heapBlock->FinishPartialCollect();
            Assert(heapBlock->HasFreeObject());
            tail = heapBlock;
        });
        Assert(tail != nullptr);
        tail->SetNextBlock(this->partialHeapBlockList);
        this->partialHeapBlockList = partialSweptList;
    }
#endif

    TBlockType * currentPartialHeapBlockList = this->partialHeapBlockList;
    if (recyclerSweep == nullptr)
    {
        if (currentPartialHeapBlockList != nullptr)
        {
            this->partialHeapBlockList = nullptr;
            this->AppendAllocableHeapBlockList(currentPartialHeapBlockList);
        }
    }
    else
    {
        if (currentPartialHeapBlockList != nullptr)
        {
            this->partialHeapBlockList = nullptr;
            TBlockType * list = this->heapBlockList;
            if (list == nullptr)
            {
                this->heapBlockList = currentPartialHeapBlockList;
            }
            else
            {
                // CONCURRENT-TODO: Optimize this?
                TBlockType * tail = HeapBlockList::Tail(this->heapBlockList);
                tail->SetNextBlock(currentPartialHeapBlockList);
            }
        }
#if ENABLE_CONCURRENT_GC
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
        if (recyclerSweep->GetPendingSweepBlockList(this) == nullptr && !this->AllocationsStartedDuringConcurrentSweep())
#else
        if (recyclerSweep->GetPendingSweepBlockList(this) == nullptr)
#endif
#endif
        {
            // nothing else to sweep now,  we can start allocating now.
            this->StartAllocationAfterSweep();
        }
    }

    RECYCLER_SLOW_CHECK(this->VerifyHeapBlockCount(recyclerSweep != nullptr && recyclerSweep->IsBackground()));
}